

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O2

void __thiscall
Encapsulation_hierarchyWaterfall_Test::TestBody(Encapsulation_hierarchyWaterfall_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  string a_parent;
  AssertHelper local_a8 [8];
  Message local_a0 [8];
  ComponentPtr child2;
  ComponentPtr child1;
  AssertionResult gtest_ar;
  ComponentPtr child3;
  ComponentPtr parent;
  ModelPtr model;
  PrinterPtr printer;
  string e_parent;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e_parent,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"parent_component\"/>\n  <component name=\"child1\"/>\n  <component name=\"child2\"/>\n  <component name=\"child3\"/>\n  <encapsulation>\n    <component_ref component=\"parent_component\">\n      <component_ref component=\"child1\">\n        <component_ref component=\"child2\">\n          <component_ref component=\"child3\"/>\n        </component_ref>\n      </component_ref>\n    </component_ref>\n  </encapsulation>\n</model>\n"
             ,(allocator<char> *)&a_parent);
  libcellml::Model::create();
  libcellml::Component::create();
  peVar1 = parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a_parent,"parent_component",(allocator<char> *)&child1);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a_parent);
  libcellml::Component::create();
  peVar1 = child1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a_parent,"child1",(allocator<char> *)&child2);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a_parent);
  libcellml::Component::create();
  peVar1 = child2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a_parent,"child2",(allocator<char> *)&child3);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a_parent);
  libcellml::Component::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a_parent,"child3",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName
            ((string *)
             child3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a_parent);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             child2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             child1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a_parent,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e_parent","a_parent",&e_parent,&a_parent);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=(local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&a_parent);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e_parent);
  return;
}

Assistant:

TEST(Encapsulation, hierarchyWaterfall)
{
    const std::string e_parent =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent_component\"/>\n"
        "  <component name=\"child1\"/>\n"
        "  <component name=\"child2\"/>\n"
        "  <component name=\"child3\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent_component\">\n"
        "      <component_ref component=\"child1\">\n"
        "        <component_ref component=\"child2\">\n"
        "          <component_ref component=\"child3\"/>\n"
        "        </component_ref>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr parent = libcellml::Component::create();
    parent->setName("parent_component");
    libcellml::ComponentPtr child1 = libcellml::Component::create();
    child1->setName("child1");
    libcellml::ComponentPtr child2 = libcellml::Component::create();
    child2->setName("child2");
    libcellml::ComponentPtr child3 = libcellml::Component::create();
    child3->setName("child3");

    child2->addComponent(child3);
    child1->addComponent(child2);
    parent->addComponent(child1);

    model->addComponent(parent);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a_parent = printer->printModel(model);
    EXPECT_EQ(e_parent, a_parent);
}